

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_impl.cpp
# Opt level: O1

MPP_RET mpp_enc_proc_tune_cfg(MppEncFineTuneCfg *dst,MppEncFineTuneCfg *src)

{
  uint uVar1;
  long lVar2;
  MPP_RET MVar3;
  MppEncFineTuneCfg *pMVar4;
  RK_U32 *pRVar5;
  byte bVar6;
  MppEncFineTuneCfg bak;
  RK_U32 local_8c [27];
  
  bVar6 = 0;
  uVar1 = src->change;
  if (uVar1 == 0) {
    MVar3 = MPP_OK;
  }
  else {
    pMVar4 = dst;
    pRVar5 = local_8c;
    for (lVar2 = 0x1b; lVar2 != 0; lVar2 = lVar2 + -1) {
      *pRVar5 = pMVar4->change;
      pMVar4 = (MppEncFineTuneCfg *)&pMVar4->scene_mode;
      pRVar5 = pRVar5 + 1;
    }
    if ((uVar1 & 1) != 0) {
      dst->scene_mode = src->scene_mode;
    }
    MVar3 = MPP_OK;
    if (MPP_ENC_SCENE_MODE_IPC_PTZ < dst->scene_mode) {
      _mpp_log_l(2,"mpp_enc","invalid scene mode %d not in range [%d, %d]\n",(char *)0x0,
                 (ulong)dst->scene_mode,0,2);
      MVar3 = MPP_ERR_VALUE;
    }
    if ((uVar1 & 2) != 0) {
      dst->deblur_en = src->deblur_en;
    }
    if ((uVar1 & 4) != 0) {
      dst->deblur_str = src->deblur_str;
    }
    if (7 < (uint)dst->deblur_str) {
      _mpp_log_l(2,"mpp_enc","invalid deblur strength not in range [0, 7]\n",(char *)0x0);
      MVar3 = MPP_ERR_VALUE;
    }
    if ((uVar1 & 8) != 0) {
      dst->anti_flicker_str = src->anti_flicker_str;
    }
    if (3 < (uint)dst->anti_flicker_str) {
      _mpp_log_l(2,"mpp_enc","invalid anti_flicker_str not in range [0 : 3]\n",(char *)0x0);
      MVar3 = MPP_ERR_VALUE;
    }
    if ((char)uVar1 < '\0') {
      dst->atr_str_i = src->atr_str_i;
    }
    if (3 < (uint)dst->atr_str_i) {
      _mpp_log_l(2,"mpp_enc","invalid atr_str not in range [0 : 3]\n",(char *)0x0);
      MVar3 = MPP_ERR_VALUE;
    }
    if ((uVar1 >> 8 & 1) != 0) {
      dst->atr_str_p = src->atr_str_p;
    }
    if (3 < (uint)dst->atr_str_p) {
      _mpp_log_l(2,"mpp_enc","invalid atr_str not in range [0 : 3]\n",(char *)0x0);
      MVar3 = MPP_ERR_VALUE;
    }
    if ((uVar1 >> 9 & 1) != 0) {
      dst->atl_str = src->atl_str;
    }
    if (3 < (uint)dst->atl_str) {
      _mpp_log_l(2,"mpp_enc","invalid atr_str not in range [0 : 3]\n",(char *)0x0);
      MVar3 = MPP_ERR_VALUE;
    }
    if ((uVar1 >> 10 & 1) != 0) {
      dst->sao_str_i = src->sao_str_i;
    }
    if (3 < (uint)dst->sao_str_i) {
      _mpp_log_l(2,"mpp_enc","invalid atr_str not in range [0 : 3]\n",(char *)0x0);
      MVar3 = MPP_ERR_VALUE;
    }
    if ((uVar1 >> 0xb & 1) != 0) {
      dst->sao_str_p = src->sao_str_p;
    }
    if (3 < (uint)dst->sao_str_p) {
      _mpp_log_l(2,"mpp_enc","invalid atr_str not in range [0 : 3]\n",(char *)0x0);
      MVar3 = MPP_ERR_VALUE;
    }
    if ((uVar1 & 0x20) != 0) {
      dst->lambda_idx_i = src->lambda_idx_i;
    }
    if (8 < (uint)dst->lambda_idx_i) {
      _mpp_log_l(2,"mpp_enc","invalid lambda idx i not in range [0, 8]\n",(char *)0x0);
      MVar3 = MPP_ERR_VALUE;
    }
    if ((uVar1 & 0x40) != 0) {
      dst->lambda_idx_p = src->lambda_idx_p;
    }
    if (8 < (uint)dst->lambda_idx_p) {
      _mpp_log_l(2,"mpp_enc","invalid lambda idx i not in range [0, 8]\n",(char *)0x0);
      MVar3 = MPP_ERR_VALUE;
    }
    if ((uVar1 >> 0xd & 1) != 0) {
      dst->rc_container = src->rc_container;
    }
    if (2 < (uint)dst->rc_container) {
      _mpp_log_l(2,"mpp_enc","invalid rc_container %d not in range [0, 2]\n",(char *)0x0);
      MVar3 = MPP_ERR_VALUE;
    }
    if ((uVar1 >> 0xe & 1) != 0) {
      dst->vmaf_opt = src->vmaf_opt;
    }
    if (1 < (uint)dst->vmaf_opt) {
      _mpp_log_l(2,"mpp_enc","invalid vmaf_opt %d not in range [0, 1]\n",(char *)0x0);
      MVar3 = MPP_ERR_VALUE;
    }
    dst->change = dst->change | uVar1;
    if (MVar3 != MPP_OK) {
      _mpp_log_l(2,"mpp_enc","failed to accept new tuning config\n","mpp_enc_proc_tune_cfg");
      pRVar5 = local_8c;
      for (lVar2 = 0x1b; lVar2 != 0; lVar2 = lVar2 + -1) {
        dst->change = *pRVar5;
        pRVar5 = pRVar5 + (ulong)bVar6 * -2 + 1;
        dst = (MppEncFineTuneCfg *)((long)dst + (ulong)bVar6 * -8 + 4);
      }
    }
  }
  return MVar3;
}

Assistant:

MPP_RET mpp_enc_proc_tune_cfg(MppEncFineTuneCfg *dst, MppEncFineTuneCfg *src)
{
    MPP_RET ret = MPP_OK;
    RK_U32 change = src->change;

    if (change) {
        MppEncFineTuneCfg bak = *dst;

        if (change & MPP_ENC_TUNE_CFG_CHANGE_SCENE_MODE)
            dst->scene_mode = src->scene_mode;

        if (dst->scene_mode < MPP_ENC_SCENE_MODE_DEFAULT ||
            dst->scene_mode >= MPP_ENC_SCENE_MODE_BUTT) {
            mpp_err("invalid scene mode %d not in range [%d, %d]\n", dst->scene_mode,
                    MPP_ENC_SCENE_MODE_DEFAULT, MPP_ENC_SCENE_MODE_BUTT - 1);
            ret = MPP_ERR_VALUE;
        }

        if (change & MPP_ENC_TUNE_CFG_CHANGE_DEBLUR_EN)
            dst->deblur_en = src->deblur_en;

        if (change & MPP_ENC_TUNE_CFG_CHANGE_DEBLUR_STR)
            dst->deblur_str = src->deblur_str;

        if (dst->deblur_str < 0 || dst->deblur_str > 7) {
            mpp_err("invalid deblur strength not in range [0, 7]\n");
            ret = MPP_ERR_VALUE;
        }

        if (change & MPP_ENC_TUNE_CFG_CHANGE_ANTI_FLICKER_STR)
            dst->anti_flicker_str = src->anti_flicker_str;

        if (dst->anti_flicker_str < 0 || dst->anti_flicker_str > 3) {
            mpp_err("invalid anti_flicker_str not in range [0 : 3]\n");
            ret = MPP_ERR_VALUE;
        }

        if (change & MPP_ENC_TUNE_CFG_CHANGE_ATR_STR_I)
            dst->atr_str_i = src->atr_str_i;

        if (dst->atr_str_i < 0 || dst->atr_str_i > 3) {
            mpp_err("invalid atr_str not in range [0 : 3]\n");
            ret = MPP_ERR_VALUE;
        }

        if (change & MPP_ENC_TUNE_CFG_CHANGE_ATR_STR_P)
            dst->atr_str_p = src->atr_str_p;

        if (dst->atr_str_p < 0 || dst->atr_str_p > 3) {
            mpp_err("invalid atr_str not in range [0 : 3]\n");
            ret = MPP_ERR_VALUE;
        }

        if (change & MPP_ENC_TUNE_CFG_CHANGE_ATL_STR)
            dst->atl_str = src->atl_str;

        if (dst->atl_str < 0 || dst->atl_str > 3) {
            mpp_err("invalid atr_str not in range [0 : 3]\n");
            ret = MPP_ERR_VALUE;
        }

        if (change & MPP_ENC_TUNE_CFG_CHANGE_SAO_STR_I)
            dst->sao_str_i = src->sao_str_i;

        if (dst->sao_str_i < 0 || dst->sao_str_i > 3) {
            mpp_err("invalid atr_str not in range [0 : 3]\n");
            ret = MPP_ERR_VALUE;
        }

        if (change & MPP_ENC_TUNE_CFG_CHANGE_SAO_STR_P)
            dst->sao_str_p = src->sao_str_p;

        if (dst->sao_str_p < 0 || dst->sao_str_p > 3) {
            mpp_err("invalid atr_str not in range [0 : 3]\n");
            ret = MPP_ERR_VALUE;
        }

        if (change & MPP_ENC_TUNE_CFG_CHANGE_LAMBDA_IDX_I)
            dst->lambda_idx_i = src->lambda_idx_i;

        if (dst->lambda_idx_i < 0 || dst->lambda_idx_i > 8) {
            mpp_err("invalid lambda idx i not in range [0, 8]\n");
            ret = MPP_ERR_VALUE;
        }

        if (change & MPP_ENC_TUNE_CFG_CHANGE_LAMBDA_IDX_P)
            dst->lambda_idx_p = src->lambda_idx_p;

        if (dst->lambda_idx_p < 0 || dst->lambda_idx_p > 8) {
            mpp_err("invalid lambda idx i not in range [0, 8]\n");
            ret = MPP_ERR_VALUE;
        }

        if (change & MPP_ENC_TUNE_CFG_CHANGE_RC_CONTAINER)
            dst->rc_container = src->rc_container;

        if (dst->rc_container < 0 || dst->rc_container > 2) {
            mpp_err("invalid rc_container %d not in range [0, 2]\n", dst->rc_container);
            ret = MPP_ERR_VALUE;
        }

        if (change & MPP_ENC_TUNE_CFG_CHANGE_VMAF_OPT)
            dst->vmaf_opt = src->vmaf_opt;

        if (dst->vmaf_opt < 0 || dst->vmaf_opt > 1) {
            mpp_err("invalid vmaf_opt %d not in range [0, 1]\n", dst->vmaf_opt);
            ret = MPP_ERR_VALUE;
        }

        dst->change |= change;

        if (ret) {
            mpp_err_f("failed to accept new tuning config\n");
            *dst = bak;
        }
    }

    return ret;
}